

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O0

int json_pointer_set_single_path
              (json_object *parent,char *path,json_object *value,
              json_pointer_array_set_cb array_set_cb,void *priv)

{
  int iVar1;
  int *piVar2;
  size_t local_40;
  size_t idx;
  void *priv_local;
  json_pointer_array_set_cb array_set_cb_local;
  json_object *value_local;
  char *path_local;
  json_object *parent_local;
  
  idx = (size_t)priv;
  priv_local = array_set_cb;
  array_set_cb_local = (json_pointer_array_set_cb)value;
  value_local = (json_object *)path;
  path_local = (char *)parent;
  iVar1 = json_object_is_type(parent,json_type_array);
  if (iVar1 == 0) {
    iVar1 = json_object_is_type((json_object *)path_local,json_type_object);
    if (iVar1 == 0) {
      piVar2 = __errno_location();
      *piVar2 = 2;
      parent_local._4_4_ = -1;
    }
    else {
      parent_local._4_4_ =
           json_object_object_add
                     ((json_object *)path_local,(char *)value_local,
                      (json_object *)array_set_cb_local);
    }
  }
  else if (((char)value_local->o_type == 0x2d) && (*(byte *)((long)&value_local->o_type + 1) == 0))
  {
    parent_local._4_4_ =
         json_object_array_add((json_object *)path_local,(json_object *)array_set_cb_local);
  }
  else {
    iVar1 = is_valid_index((char *)value_local,&local_40);
    if (iVar1 == 0) {
      parent_local._4_4_ = -1;
    }
    else {
      parent_local._4_4_ = (*(code *)priv_local)(path_local,local_40,array_set_cb_local,idx);
    }
  }
  return parent_local._4_4_;
}

Assistant:

static int json_pointer_set_single_path(struct json_object *parent, const char *path,
                                        struct json_object *value,
					json_pointer_array_set_cb array_set_cb, void *priv)
{
	if (json_object_is_type(parent, json_type_array))
	{
		size_t idx;
		/* RFC (Chapter 4) states that '-' may be used to add new elements to an array */
		if (path[0] == '-' && path[1] == '\0')
			return json_object_array_add(parent, value);
		if (!is_valid_index(path, &idx))
			return -1;
		return array_set_cb(parent, idx, value, priv);
	}

	/* path replacements should have been done in json_pointer_get_single_path(),
	 * and we should still be good here
	 */
	if (json_object_is_type(parent, json_type_object))
		return json_object_object_add(parent, path, value);

	/* Getting here means that we tried to "dereference" a primitive JSON type
	 * (like string, int, bool).i.e. add a sub-object to it
	 */
	errno = ENOENT;
	return -1;
}